

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *this)

{
  QString::~QString((QString *)0x4042a0);
  QStringBuilder<QString,_char16_t>::~QStringBuilder((QStringBuilder<QString,_char16_t> *)0x4042aa);
  return;
}

Assistant:

~QStringBuilder() = default;